

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<4096,unsigned_long>
               (hashfunc<unsigned_long> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  byte in_DL;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  unsigned_long h;
  keytype k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  undefined4 in_stack_fffffffffffffdbc;
  byte bVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdc0;
  Blob<4096> *in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdd7;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  pfHash in_stack_fffffffffffffde0;
  uint8_t in_stack_fffffffffffffe9b;
  uint8_t in_stack_fffffffffffffe9c;
  uint8_t in_stack_fffffffffffffe9d;
  uint8_t in_stack_fffffffffffffe9e;
  uint8_t in_stack_fffffffffffffe9f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_DL & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x1000,pcVar4,(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x148b4f);
  Blob<4096>::Blob((Blob<4096> *)&stack0xfffffffffffffdd8);
  memset(&stack0xfffffffffffffdd8,0,0x200);
  if ((local_d & 1) != 0) {
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xfffffffffffffdd8,0x200,0,&stack0xfffffffffffffdc0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_fffffffffffffdc0,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffdbc,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<4096>,unsigned_long>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
             (bool)in_stack_fffffffffffffdd7,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar1 = TestHashList<unsigned_long>
                    (in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f,
                     (bool)in_stack_fffffffffffffe9e,(bool)in_stack_fffffffffffffe9d,
                     (bool)in_stack_fffffffffffffe9c,(bool)in_stack_fffffffffffffe9b);
  bVar5 = bVar1 & bVar5;
  printf("\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffdc0);
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}